

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O2

Path * __thiscall FileSystemUtils::Path::ParentPath(Path *__return_storage_ptr__,Path *this)

{
  string *psVar1;
  ulong uVar2;
  string asStack_48 [32];
  
  Path(__return_storage_ptr__,&this->m_string);
  if ((__return_storage_ptr__->m_string)._M_string_length != 0) {
    psVar1 = &__return_storage_ptr__->m_string;
    while( true ) {
      uVar2 = std::__cxx11::string::find_last_of((char *)psVar1,0x11a04e);
      if (uVar2 != (__return_storage_ptr__->m_string)._M_string_length - 1) break;
      std::__cxx11::string::erase((ulong)psVar1,uVar2);
    }
    uVar2 = std::__cxx11::string::find_last_of((char *)psVar1,0x11a04e);
    if (uVar2 < (__return_storage_ptr__->m_string)._M_string_length) {
      std::__cxx11::string::substr((ulong)asStack_48,(ulong)psVar1);
      std::__cxx11::string::_M_assign((string *)psVar1);
      std::__cxx11::string::~string(asStack_48);
      while( true ) {
        uVar2 = std::__cxx11::string::find_last_of((char *)psVar1,0x11a04e);
        if (uVar2 != (__return_storage_ptr__->m_string)._M_string_length - 1) break;
        std::__cxx11::string::erase((ulong)psVar1,uVar2);
      }
    }
    else {
      std::__cxx11::string::assign((char *)psVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Path Path::ParentPath() const
	{
		Path parentpath = m_string;

        if( parentpath.m_string.length() == 0 )
        {
            return parentpath;
        }
		//remove any trailing seperators
		while( parentpath.m_string.find_last_of( FILESYSTEMUTILS_SEPERATORS ) == parentpath.m_string.length()-1 )
		{
			parentpath.m_string.erase(parentpath.m_string.length()-1, 1);
		}

		size_t pos = parentpath.m_string.find_last_of( FILESYSTEMUTILS_SEPERATORS );
		if( pos < parentpath.m_string.length() )
		{
			parentpath = parentpath.m_string.substr(0, pos);

			//remove any trailing seperators
			while( parentpath.m_string.find_last_of( FILESYSTEMUTILS_SEPERATORS ) == parentpath.m_string.length()-1)
			{
                parentpath.m_string.erase(parentpath.m_string.length()-1, 1);
			}
		}
		else
		{
			// no seperators, so parentpath is empty path
			parentpath = "";
		}

		return parentpath;
	}